

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall Parser::parsePoint(Parser *this,QString *data,qsizetype offset)

{
  long from;
  Data *pDVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong from_00;
  ulong uVar7;
  qsizetype qVar8;
  QString *str;
  QString *str_00;
  QString *str_01;
  qsizetype in_R8;
  long in_FS_OFFSET;
  QStringView lhs;
  QStringView rhs;
  QString local_c0;
  QString local_a8;
  QString local_88;
  Point local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.name.d.d = (Data *)(data->d).ptr;
  local_68.name.d.ptr = (char16_t *)(data->d).size;
  uVar5 = QStringView::indexOf((QStringView *)&local_68,(QChar)0x28,offset,CaseSensitive);
  local_68.name.d.d = (Data *)(data->d).ptr;
  local_68.name.d.ptr = (char16_t *)(data->d).size;
  uVar6 = QStringView::indexOf((QStringView *)&local_68,(QChar)0x2c,uVar5,CaseSensitive);
  local_68.parameters.d.ptr = (char16_t *)0x0;
  local_68.parameters.d.size = 0;
  local_68.name.d.size = 0;
  local_68.parameters.d.d = (Data *)0x0;
  local_68.name.d.d = (Data *)0x0;
  local_68.name.d.ptr = (char16_t *)0x0;
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::mid(&local_a8,data,uVar5 + 1,~uVar5 + uVar6);
  QString::simplified_helper(&local_88,&local_a8,str);
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((storage_type_conflict *)local_88.d.size == (storage_type_conflict *)(this->m_provider).d.size
     ) {
    lhs.m_size = (qsizetype)(this->m_provider).d.ptr;
    lhs.m_data = (storage_type_conflict *)local_88.d.size;
    rhs.m_size = in_R8;
    rhs.m_data = (storage_type_conflict *)local_88.d.size;
    bVar4 = QtPrivate::equalStrings((QtPrivate *)local_88.d.ptr,lhs,rhs);
    if (bVar4) {
      from = uVar6 + 1;
      local_a8.d.d = (Data *)(data->d).ptr;
      local_a8.d.ptr = (char16_t *)(data->d).size;
      from_00 = QStringView::indexOf((QStringView *)&local_a8,(QChar)0x2c,from,CaseSensitive);
      local_a8.d.d = (Data *)(data->d).ptr;
      local_a8.d.ptr = (char16_t *)(data->d).size;
      uVar7 = QStringView::indexOf((QStringView *)&local_a8,(QChar)0x29,from,CaseSensitive);
      uVar5 = uVar7;
      if ((long)from_00 <= (long)uVar7 && from_00 != 0xffffffffffffffff) {
        uVar5 = from_00;
      }
      QString::mid(&local_c0,data,from,~uVar6 + uVar5);
      QString::simplified_helper(&local_a8,&local_c0,str_00);
      pcVar3 = local_68.name.d.ptr;
      pDVar2 = local_68.name.d.d;
      qVar8 = local_a8.d.size;
      pDVar1 = local_a8.d.d;
      local_a8.d.d = local_68.name.d.d;
      local_68.name.d.d = pDVar1;
      local_68.name.d.ptr = local_a8.d.ptr;
      local_a8.d.ptr = pcVar3;
      local_a8.d.size = local_68.name.d.size;
      local_68.name.d.size = qVar8;
      if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
        }
      }
      if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((long)from_00 <= (long)uVar7 && from_00 != 0xffffffffffffffff) {
        local_a8.d.d = (Data *)(data->d).ptr;
        local_a8.d.ptr = (char16_t *)(data->d).size;
        qVar8 = QStringView::indexOf((QStringView *)&local_a8,(QChar)0x29,from_00,CaseSensitive);
        QString::mid(&local_c0,data,from_00 + 1,~from_00 + (long)(int)qVar8);
        QString::simplified_helper(&local_a8,&local_c0,str_01);
        pcVar3 = local_68.parameters.d.ptr;
        pDVar2 = local_68.parameters.d.d;
        qVar8 = local_a8.d.size;
        pDVar1 = local_a8.d.d;
        local_a8.d.d = local_68.parameters.d.d;
        local_68.parameters.d.d = pDVar1;
        local_68.parameters.d.ptr = local_a8.d.ptr;
        local_a8.d.ptr = pcVar3;
        local_a8.d.size = local_68.parameters.d.size;
        local_68.parameters.d.size = qVar8;
        if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
          }
        }
        if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      QtPrivate::QGenericArrayOps<Point>::emplace<Point_const&>
                ((QGenericArrayOps<Point> *)&this->m_points,(this->m_points).d.size,&local_68);
      QList<Point>::end(&this->m_points);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.parameters.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.parameters.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.parameters.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.parameters.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_68.parameters.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::parsePoint(const QString &data, qsizetype offset)
{
    qsizetype beginOfProvider = data.indexOf(QLatin1Char('('), offset);
    qsizetype endOfProvider = data.indexOf(QLatin1Char(','), beginOfProvider);
    Point point;
    QString provider = data.mid(beginOfProvider + 1, endOfProvider - beginOfProvider - 1).simplified();
    if (provider != m_provider)
        return;

    qsizetype endOfPoint = data.indexOf(QLatin1Char(','), endOfProvider + 1);
    qsizetype endOfPoint2 = data.indexOf(QLatin1Char(')'), endOfProvider + 1);
    bool params = true;
    if (endOfPoint == -1 || endOfPoint2 < endOfPoint) {
        endOfPoint = endOfPoint2;
        params = false;
    }
    point.name = data.mid(endOfProvider + 1, endOfPoint - endOfProvider - 1).simplified();
    if (params) {
        int endOfParams = data.indexOf(QLatin1Char(')'), endOfPoint);
        point.parameters = data.mid(endOfPoint + 1, endOfParams - endOfPoint - 1).simplified();
    }

    DEBUGPRINTF(printf("tracepointgen: %s(%s)\n", qPrintable(point.name), qPrintable(point.parameters)));

    m_points.push_back(point);
}